

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

void writeString(char *out,int i,QByteArray *str,int offsetOfStringdataMember,int *stringdataOffset)

{
  long lVar1;
  int iVar2;
  int iVar3;
  qsizetype qVar4;
  char *__src;
  int in_ECX;
  QByteArray *in_RDX;
  int in_ESI;
  long in_RDI;
  int *in_R8;
  long in_FS_OFFSET;
  int offset;
  int size;
  uint offsetLen [2];
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar4 = QByteArray::size(in_RDX);
  iVar2 = (int)qVar4;
  iVar3 = in_ECX + *in_R8;
  local_10 = CONCAT44(iVar2,iVar3);
  *(undefined8 *)(in_RDI + (long)(in_ESI * 2) * 4) = local_10;
  __src = QByteArray::constData((QByteArray *)0x3751d9);
  memcpy((void *)(in_RDI + iVar3),__src,(long)iVar2);
  *(undefined1 *)(in_RDI + (iVar3 + iVar2)) = 0;
  *in_R8 = iVar2 + 1 + *in_R8;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void writeString(char *out, int i, const QByteArray &str,
                        const int offsetOfStringdataMember, int &stringdataOffset)
{
    int size = str.size();
    int offset = offsetOfStringdataMember + stringdataOffset;
    uint offsetLen[2] = { uint(offset), uint(size) };

    memcpy(out + 2 * i * sizeof(uint), &offsetLen, 2 * sizeof(uint));

    memcpy(out + offset, str.constData(), size);
    out[offset + size] = '\0';

    stringdataOffset += size + 1;
}